

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpp_wrapper2.cpp
# Opt level: O3

void cpp_wrapper_equality
               (planck_unit_test_t *tc,Dictionary<int,_int> *dict,int key,int *expected_values,
               int expected_num_records,ion_boolean_t key_exists)

{
  ulong uVar1;
  byte bVar2;
  planck_unit_result_t pVar3;
  ion_cursor_status_t iVar4;
  char cVar5;
  Cursor<int,_int> *this;
  ulong uVar6;
  int actual;
  ion_record_t *piVar7;
  ulong local_40;
  
  this = Dictionary<int,_int>::equality(dict,key);
  bVar2 = this->cursor->status - 2;
  if (key_exists == '\0') {
    pVar3 = planck_unit_assert_true
                      (tc,(uint)((bVar2 & 0xfd) != 0),0x6e,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test2/test_cpp_wrapper2.cpp"
                       ,"condition was true, expected false");
    if (pVar3 == '\0') goto LAB_00105e31;
    iVar4 = (*this->cursor->next)(this->cursor,&this->record);
    cVar5 = planck_unit_assert_true
                      (tc,(uint)((iVar4 - 2U & 0xfd) != 0),0x6f,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test2/test_cpp_wrapper2.cpp"
                       ,"condition was true, expected false");
  }
  else {
    pVar3 = planck_unit_assert_true
                      (tc,(uint)((bVar2 & 0xfd) == 0),0x79,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test2/test_cpp_wrapper2.cpp"
                       ,"condition was false, expected true");
    if (pVar3 == '\0') goto LAB_00105e31;
    piVar7 = &this->record;
    iVar4 = (*this->cursor->next)(this->cursor,piVar7);
    if ((iVar4 == '\x04') || (actual = 0, iVar4 == '\x02')) {
      local_40 = 0;
      actual = 0;
      do {
        uVar1 = local_40;
        if (0 < key) {
          uVar6 = 0;
          do {
            uVar1 = uVar6;
            if (expected_values[uVar6] == *(this->record).value) break;
            uVar6 = uVar6 + 1;
            uVar1 = local_40;
          } while ((uint)key != uVar6);
        }
        local_40 = uVar1;
        pVar3 = planck_unit_assert_int_are_equal
                          (tc,key,*piVar7->key,0x85,
                           "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test2/test_cpp_wrapper2.cpp"
                          );
        if (pVar3 == '\0') goto LAB_00105e31;
        pVar3 = planck_unit_assert_int_are_equal
                          (tc,expected_values[(int)local_40],*(this->record).value,0x86,
                           "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test2/test_cpp_wrapper2.cpp"
                          );
        if (pVar3 == '\0') goto LAB_00105e31;
        expected_values[(int)local_40] = 999;
        iVar4 = (*this->cursor->next)(this->cursor,piVar7);
        actual = actual + 1;
      } while ((iVar4 == '\x02') || (iVar4 == '\x04'));
    }
    pVar3 = planck_unit_assert_true
                      (tc,(uint)((this->cursor->status - 2U & 0xfd) != 0),0x8d,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test2/test_cpp_wrapper2.cpp"
                       ,"condition was true, expected false");
    if (pVar3 == '\0') goto LAB_00105e31;
    cVar5 = planck_unit_assert_int_are_equal
                      (tc,expected_num_records,actual,0x90,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test2/test_cpp_wrapper2.cpp"
                      );
  }
  if (cVar5 != '\0') {
    Cursor<int,_int>::~Cursor(this);
    operator_delete(this);
    return;
  }
LAB_00105e31:
  longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
}

Assistant:

void
cpp_wrapper_equality(
	planck_unit_test_t *tc,
	Dictionary<int, int> *dict,
	int key,
	int expected_values[],
	int expected_num_records,
	ion_boolean_t key_exists
) {
	Cursor<int, int> *cursor = dict->equality(key);

	if (!key_exists) {
		PLANCK_UNIT_ASSERT_FALSE(tc, cursor->hasNext());
		PLANCK_UNIT_ASSERT_FALSE(tc, cursor->next());

		delete cursor;

		return;
	}

	int records_found	= 0;
	int curr_pos		= 0;

	PLANCK_UNIT_ASSERT_TRUE(tc, cursor->hasNext());

	ion_cursor_status_t status = cursor->next();

	while (status) {
		for (int i = 0; i < key; i++) {
			if (expected_values[i] == cursor->getValue()) {
				curr_pos = i;
				break;
			}
		}

		PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, key, cursor->getKey());
		PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, expected_values[curr_pos], cursor->getValue());

		expected_values[curr_pos]	= NULL_VALUE;
		status						= cursor->next();
		records_found++;
	}

	PLANCK_UNIT_ASSERT_FALSE(tc, cursor->hasNext());

	/* Check that same number of records are found as were inserted with desired key. */
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, expected_num_records, records_found);

	delete cursor;
}